

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

void rprog_set(ROOM_INDEX_DATA *room,char *progtype,char *name)

{
  bool bVar1;
  char *pcVar2;
  char *in_RDX;
  short *in_RSI;
  CLogger *in_RDI;
  __type_conflict2 _Var3;
  string_view in_stack_00000000;
  int i;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  local_1c = 0;
  while ((rprog_table[local_1c].name != (char *)0x0 &&
         (bVar1 = str_cmp(rprog_table[local_1c].name,in_RDX), bVar1))) {
    local_1c = local_1c + 1;
  }
  if (rprog_table[local_1c].name == (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    CLogger::Warn<short&>(in_RDI,in_stack_00000000,in_RSI);
  }
  else {
    bVar1 = str_cmp((char *)in_RSI,"pulse_prog");
    if (bVar1) {
      bVar1 = str_cmp((char *)in_RSI,"entry_prog");
      if (bVar1) {
        bVar1 = str_cmp((char *)in_RSI,"move_prog");
        if (bVar1) {
          bVar1 = str_cmp((char *)in_RSI,"drop_prog");
          if (bVar1) {
            bVar1 = str_cmp((char *)in_RSI,"speech_prog");
            if (bVar1) {
              bVar1 = str_cmp((char *)in_RSI,"open_prog");
              if (bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
                CLogger::Error<short&>(in_RDI,in_stack_00000000,in_RSI);
                exit(1);
              }
              *(void **)(*(long *)(in_RDI + 0x178) + 0x28) = rprog_table[local_1c].function;
              free_pstring(in_stack_ffffffffffffffc0);
              pcVar2 = palloc_string(in_RDX);
              *(char **)(*(long *)(in_RDI + 0x178) + 0x58) = pcVar2;
              _Var3 = std::pow<int,int>(0,0x6bee15);
              *(ulong *)(in_RDI + 0x180) = (long)_Var3 | *(ulong *)(in_RDI + 0x180);
            }
            else {
              *(void **)(*(long *)(in_RDI + 0x178) + 0x20) = rprog_table[local_1c].function;
              free_pstring(in_stack_ffffffffffffffc0);
              pcVar2 = palloc_string(in_RDX);
              *(char **)(*(long *)(in_RDI + 0x178) + 0x50) = pcVar2;
              _Var3 = std::pow<int,int>(0,0x6bed77);
              *(ulong *)(in_RDI + 0x180) = (long)_Var3 | *(ulong *)(in_RDI + 0x180);
            }
          }
          else {
            *(void **)(*(long *)(in_RDI + 0x178) + 0x18) = rprog_table[local_1c].function;
            free_pstring(in_stack_ffffffffffffffc0);
            pcVar2 = palloc_string(in_RDX);
            *(char **)(*(long *)(in_RDI + 0x178) + 0x48) = pcVar2;
            _Var3 = std::pow<int,int>(0,0x6becd9);
            *(ulong *)(in_RDI + 0x180) = (long)_Var3 | *(ulong *)(in_RDI + 0x180);
          }
        }
        else {
          *(void **)(*(long *)(in_RDI + 0x178) + 0x10) = rprog_table[local_1c].function;
          if (in_RDI != (CLogger *)0xfffffffffffffe80) {
            free_pstring(in_stack_ffffffffffffffc0);
          }
          pcVar2 = palloc_string(in_RDX);
          *(char **)(*(long *)(in_RDI + 0x178) + 0x40) = pcVar2;
          _Var3 = std::pow<int,int>(0,0x6bec3b);
          *(ulong *)(in_RDI + 0x180) = (long)_Var3 | *(ulong *)(in_RDI + 0x180);
        }
      }
      else {
        *(void **)(*(long *)(in_RDI + 0x178) + 8) = rprog_table[local_1c].function;
        free_pstring(in_stack_ffffffffffffffc0);
        pcVar2 = palloc_string(in_RDX);
        *(char **)(*(long *)(in_RDI + 0x178) + 0x38) = pcVar2;
        _Var3 = std::pow<int,int>(0,0x6beb8f);
        *(ulong *)(in_RDI + 0x180) = (long)_Var3 | *(ulong *)(in_RDI + 0x180);
      }
    }
    else {
      **(undefined8 **)(in_RDI + 0x178) = rprog_table[local_1c].function;
      free_pstring(in_stack_ffffffffffffffc0);
      pcVar2 = palloc_string(in_RDX);
      *(char **)(*(long *)(in_RDI + 0x178) + 0x30) = pcVar2;
      _Var3 = std::pow<int,int>(0,0x6beaf1);
      *(ulong *)(in_RDI + 0x180) = (long)_Var3 | *(ulong *)(in_RDI + 0x180);
    }
  }
  return;
}

Assistant:

void rprog_set(ROOM_INDEX_DATA *room, const char *progtype, const char *name)
{
	int i;

	for (i = 0; rprog_table[i].name; i++)
	{
		if (!str_cmp(rprog_table[i].name, name))
			break;
	}

	if (!rprog_table[i].name)
	{
		RS.Logger.Warn("Load_improgs: 'R': Function not found for vnum {}", room->vnum);
		return;
	}

	// IF YOU ADD A NEW TYPE ALSO PUT IT IN DB.C DO_ADUMP
	if (!str_cmp(progtype, "pulse_prog"))
	{
		room->rprogs->pulse_prog = (RPROG_FUN_PULSE *)rprog_table[i].function;
		free_pstring(room->rprogs->pulse_name);
		room->rprogs->pulse_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_PULSE);
		return;
	}

	if (!str_cmp(progtype, "entry_prog"))
	{
		room->rprogs->entry_prog = (RPROG_FUN_ENTRY *)rprog_table[i].function;
		free_pstring(room->rprogs->entry_name);
		room->rprogs->entry_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_ENTRY);
		return;
	}

	if (!str_cmp(progtype, "move_prog"))
	{
		room->rprogs->move_prog = (RPROG_FUN_MOVE *)rprog_table[i].function;

		if (room->progtypes)
			free_pstring(room->rprogs->move_name);

		room->rprogs->move_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_MOVE);
		return;
	}

	if (!str_cmp(progtype, "drop_prog"))
	{
		room->rprogs->drop_prog = (RPROG_FUN_DROP *)rprog_table[i].function;
		free_pstring(room->rprogs->drop_name);
		room->rprogs->drop_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_DROP);
		return;
	}

	if (!str_cmp(progtype, "speech_prog"))
	{
		room->rprogs->speech_prog = (RPROG_FUN_SPEECH *)rprog_table[i].function;
		free_pstring(room->rprogs->speech_name);
		room->rprogs->speech_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_SPEECH);
		return;
	}

	if (!str_cmp(progtype, "open_prog"))
	{
		room->rprogs->open_prog = (RPROG_FUN_OPEN *)rprog_table[i].function;
		free_pstring(room->rprogs->open_name);
		room->rprogs->open_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_OPEN);
		return;
	}

	RS.Logger.Error("Load_improgs: 'R': invalid program type for vnum {}", room->vnum);
	exit(1);
}